

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_MappingTag::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_MappingTag *this)

{
  TYPE TVar1;
  bool bVar2;
  undefined1 local_99;
  undefined1 local_98 [7];
  uchar u;
  ON_SHA1 sha1;
  bool bHashXform;
  bool bHashIdAndCRC;
  bool bHashType;
  ON_MappingTag *this_local;
  
  sha1.m_sha1_hash.m_digest[0x13] = '\x01';
  sha1.m_sha1_hash.m_digest[0x12] = '\0';
  sha1.m_sha1_hash.m_digest[0x11] = '\0';
  TVar1 = this->m_mapping_type;
  if (TVar1 == no_mapping) {
    sha1.m_sha1_hash.m_digest[0x13] = '\0';
  }
  else if (TVar1 != srfp_mapping) {
    if (TVar1 - plane_mapping < 8) {
      bVar2 = IsSet(this);
      if (bVar2) {
        sha1.m_sha1_hash.m_digest[0x12] = '\x01';
        bVar2 = ON_Xform::IsIdentity(&this->m_mesh_xform,2.3283064365386963e-10);
        if (((!bVar2) && (bVar2 = ON_Xform::IsZero(&this->m_mesh_xform), !bVar2)) &&
           (bVar2 = ON_Xform::IsValid(&this->m_mesh_xform), bVar2)) {
          sha1.m_sha1_hash.m_digest[0x11] = '\x01';
        }
      }
      else {
        sha1.m_sha1_hash.m_digest[0x13] = '\0';
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x3483,"","Invalid m_mapping_type value.");
    }
  }
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_98);
  if ((sha1.m_sha1_hash.m_digest[0x13] & 1) != 0) {
    local_99 = (undefined1)this->m_mapping_type;
    ON_SHA1::AccumulateBytes((ON_SHA1 *)local_98,&local_99,1);
  }
  if ((sha1.m_sha1_hash.m_digest[0x12] & 1) != 0) {
    ON_SHA1::AccumulateId((ON_SHA1 *)local_98,&this->m_mapping_id);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)local_98,this->m_mapping_crc);
  }
  if ((sha1.m_sha1_hash.m_digest[0x11] & 1) != 0) {
    ON_SHA1::AccumulateTransformation((ON_SHA1 *)local_98,&this->m_mesh_xform);
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_98);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_MappingTag::Hash() const
{
  bool bHashType = true;
  bool bHashIdAndCRC = false;
  bool bHashXform = false;
  switch (m_mapping_type)
  {
  case ON_TextureMapping::TYPE::no_mapping:
    bHashType = false;
    break;
  case ON_TextureMapping::TYPE::srfp_mapping:
    break;
  case ON_TextureMapping::TYPE::plane_mapping:
  case ON_TextureMapping::TYPE::cylinder_mapping:
  case ON_TextureMapping::TYPE::sphere_mapping:
  case ON_TextureMapping::TYPE::box_mapping:
  case ON_TextureMapping::TYPE::mesh_mapping_primitive:
  case ON_TextureMapping::TYPE::srf_mapping_primitive:
  case ON_TextureMapping::TYPE::brep_mapping_primitive:
  case ON_TextureMapping::TYPE::ocs_mapping:
    if (IsSet())
    {
      bHashIdAndCRC = true;
      if (false == m_mesh_xform.IsIdentity(ON_ZERO_TOLERANCE) && false == m_mesh_xform.IsZero() && m_mesh_xform.IsValid())
        bHashXform = true;
    }
    else
      bHashType = false; // bogus mapping - treat as unset 
    break;
  default:
    // Perhaps somebody added a value to the enum after June 2020 and failed to update this code?
    ON_ERROR("Invalid m_mapping_type value.");
    break;
  }

  ON_SHA1 sha1;
  if (bHashType)
  {
    const unsigned char u = (unsigned char)m_mapping_type;
    sha1.AccumulateBytes(&u,1);
  }
  if (bHashIdAndCRC)
  {
    sha1.AccumulateId(m_mapping_id);
    sha1.AccumulateInteger32(m_mapping_crc);
  }
  if (bHashXform)
  {
    sha1.AccumulateTransformation(m_mesh_xform);
  }
  return sha1.Hash();
}